

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringDictionary.cpp
# Opt level: O2

Handle __thiscall
soul::StringDictionary::getHandleForString(StringDictionary *this,string_view text)

{
  pointer pIVar1;
  bool bVar2;
  pointer pIVar3;
  uint32_t uVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator<char> local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [40];
  
  local_68._M_str = text._M_str;
  local_68._M_len = text._M_len;
  if (local_68._M_len == 0) {
    uVar4 = 0;
  }
  else {
    pIVar1 = (this->strings).
             super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar3 = (this->strings).
                  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1)
    {
      __x._M_str = (pIVar3->text)._M_dataplus._M_p;
      __x._M_len = (pIVar3->text)._M_string_length;
      bVar2 = std::operator==(__x,text);
      if (bVar2) {
        return (Handle)(pIVar3->handle).handle;
      }
    }
    uVar4 = this->nextIndex;
    this->nextIndex = uVar4 + 1;
    local_58._0_4_ = uVar4;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)(local_58 + 8),&local_68,&local_69);
    std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
    emplace_back<soul::StringDictionary::Item>(&this->strings,(Item *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  return (Handle)uVar4;
}

Assistant:

StringDictionary::Handle StringDictionary::getHandleForString (std::string_view text)
    {
        if (text.empty())
            return {};

        for (auto& s : strings)
            if (s.text == text)
                return s.handle;

        auto handle = StringDictionary::Handle { nextIndex++ };
        strings.push_back ({ handle, std::string (text) });
        return handle;
    }